

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O2

void __thiscall
SubcommandProgram_MultipleArgs_Test::~SubcommandProgram_MultipleArgs_Test
          (SubcommandProgram_MultipleArgs_Test *this)

{
  SubcommandProgram::~SubcommandProgram(&this->super_SubcommandProgram);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(SubcommandProgram, MultipleArgs) {
    args = {"start", "stop"};

    run();

    EXPECT_EQ((size_t)2, app.get_subcommands().size());
}